

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

int __thiscall rcg::Interface::open(Interface *this,char *__file,int __oflag,...)

{
  PTLUpdateInterfaceList p_Var1;
  PTLOpenInterface p_Var2;
  GC_ERROR GVar3;
  int extraout_EAX;
  element_type *peVar4;
  element_type *peVar5;
  void *pvVar6;
  char *pcVar7;
  undefined8 uVar8;
  int __oflag_00;
  int __fd;
  mutex *__file_00;
  lock_guard<std::mutex> lock;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000590;
  string *in_stack_00000598;
  GenTLException *in_stack_000005a0;
  mutex_type *in_stack_ffffffffffffff78;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  allocator *paVar9;
  allocator local_41;
  string local_40 [56];
  Interface *local_8;
  
  __file_00 = &this->mtx;
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (this->n_open == 0) {
    peVar4 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x142e67);
    System::open(peVar4,(char *)__file_00,__oflag_00);
    peVar5 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x142e7f);
    p_Var1 = peVar5->TLUpdateInterfaceList;
    peVar4 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x142e99);
    pvVar6 = System::getHandle(peVar4);
    (*p_Var1)(pvVar6,(bool8_t *)0x0,10);
    peVar5 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x142ecd);
    p_Var2 = peVar5->TLOpenInterface;
    peVar4 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x142ee7);
    pvVar6 = System::getHandle(peVar4);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    GVar3 = (*p_Var2)(pvVar6,pcVar7,&this->ifh);
    __fd = (int)pcVar7;
    if (GVar3 != 0) {
      peVar4 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x142f3d);
      System::close(peVar4,__fd);
      uVar8 = __cxa_allocate_exception(0x28);
      paVar9 = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Interface::open()",paVar9);
      GenTLException::GenTLException(in_stack_000005a0,in_stack_00000598,in_stack_00000590);
      __cxa_throw(uVar8,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
  }
  this->n_open = this->n_open + 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x14302b);
  return extraout_EAX;
}

Assistant:

void Interface::open()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (n_open == 0)
  {
    parent->open();

    // updating before opening is apparently necessary for some TLs

    gentl->TLUpdateInterfaceList(parent->getHandle(), 0, 10);

    if (gentl->TLOpenInterface(parent->getHandle(), id.c_str(), &ifh) != GenTL::GC_ERR_SUCCESS)
    {
      parent->close();
      throw GenTLException("Interface::open()", gentl);
    }
  }

  n_open++;
}